

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popt.c
# Opt level: O0

poptOption *
findOption(poptOption *opt,char *longName,size_t longNameLen,char shortName,
          poptCallbackType *callback,void **callbackData,uint argInfo)

{
  int iVar1;
  poptOption *ppVar2;
  bool bVar3;
  char *local_78;
  poptArg local_70;
  poptOption *opt2;
  poptArg arg;
  poptArg cbarg;
  poptOption *cb;
  void **callbackData_local;
  poptCallbackType *callback_local;
  size_t sStack_28;
  char shortName_local;
  size_t longNameLen_local;
  char *longName_local;
  poptOption *opt_local;
  
  cbarg.ptr = (void *)0x0;
  cb = (poptOption *)callbackData;
  callbackData_local = callback;
  callback_local._7_1_ = shortName;
  sStack_28 = longNameLen;
  longNameLen_local = (size_t)longName;
  longName_local = (char *)opt;
  memset(&arg,0,8);
  if (((((argInfo & 0x80000000) != 0) && (callback_local._7_1_ == '\0')) && (longNameLen_local != 0)
      ) && (*(char *)longNameLen_local == '\0')) {
    callback_local._7_1_ = '-';
  }
  while( true ) {
    bVar3 = true;
    if ((*(long *)longName_local == 0) && (bVar3 = true, longName_local[8] == '\0')) {
      bVar3 = *(long *)(longName_local + 0x10) != 0;
    }
    if (!bVar3) break;
    opt2 = *(poptOption **)(longName_local + 0x10);
    if ((*(uint *)(longName_local + 0xc) & _poptArgMask) == 4) {
      if (opt2 == poptHelpOptions) {
        opt2 = poptHelpOptionsI18N;
      }
      if ((opt2 != (poptOption *)0x0) &&
         (ppVar2 = findOption(opt2,(char *)longNameLen_local,sStack_28,callback_local._7_1_,
                              (poptCallbackType *)callbackData_local,&cb->longName,argInfo),
         ppVar2 != (poptOption *)0x0)) {
        if ((callbackData_local != (void **)0x0) &&
           (((*callbackData_local != (void *)0x0 && (cb != (poptOption *)0x0)) &&
            (cb->longName == (char *)0x0)))) {
          cb->longName = *(char **)(longName_local + 0x20);
        }
        return ppVar2;
      }
    }
    else if ((*(uint *)(longName_local + 0xc) & _poptArgMask) == 5) {
      cbarg.intp = (int *)longName_local;
      arg = *(poptArg *)(longName_local + 0x10);
    }
    else if (((((longNameLen_local != 0) && (*(long *)longName_local != 0)) &&
              (((argInfo & 0x80000000) == 0 || ((*(uint *)(longName_local + 0xc) & 0x80000000) != 0)
               ))) && (iVar1 = longOptionStrcmp((poptOption *)longName_local,
                                                (char *)longNameLen_local,sStack_28), iVar1 != 0))
            || ((callback_local._7_1_ != '\0' && (callback_local._7_1_ == longName_local[8]))))
    break;
    longName_local = longName_local + 0x30;
  }
  if ((*(long *)longName_local == 0) && (longName_local[8] == '\0')) {
    return (poptOption *)0x0;
  }
  if (callbackData_local != (void **)0x0) {
    if (cbarg.ptr == (void *)0x0) {
      local_70.ptr = (void *)0x0;
    }
    else {
      local_70 = arg;
    }
    *callbackData_local = (void *)local_70;
  }
  if (cb != (poptOption *)0x0) {
    if ((cbarg.ptr == (void *)0x0) || (((cbarg.opt)->argInfo & 0x20000000) != 0)) {
      local_78 = (char *)0x0;
    }
    else {
      local_78 = (cbarg.opt)->descrip;
    }
    cb->longName = local_78;
  }
  return (poptOption *)longName_local;
}

Assistant:

static const struct poptOption *
findOption(const struct poptOption * opt,
		const char * longName, size_t longNameLen,
		char shortName,
		poptCallbackType * callback,
		const void ** callbackData,
		unsigned int argInfo)
{
    const struct poptOption * cb = NULL;
    poptArg cbarg = { .ptr = NULL };

    /* This happens when a single - is given */
    if (LF_ISSET(ONEDASH) && !shortName && (longName && *longName == '\0'))
	shortName = '-';

    for (; opt->longName || opt->shortName || opt->arg; opt++) {
	poptArg arg = { .ptr = opt->arg };

	switch (poptArgType(opt)) {
	case POPT_ARG_INCLUDE_TABLE:	/* Recurse on included sub-tables. */
	{   const struct poptOption * opt2;

	    poptSubstituteHelpI18N(arg.opt);	/* XXX side effects */
	    if (arg.ptr == NULL) continue;	/* XXX program error */
	    opt2 = findOption(arg.opt, longName, longNameLen, shortName, callback,
			      callbackData, argInfo);
	    if (opt2 == NULL) continue;
	    /* Sub-table data will be inherited if no data yet. */
	    if (callback && *callback
	     && callbackData && *callbackData == NULL)
		*callbackData = opt->descrip;
	    return opt2;
	}   break;
	case POPT_ARG_CALLBACK:
	    cb = opt;
	    cbarg.ptr = opt->arg;
	    continue;
	    break;
	default:
	    break;
	}

	if (longName != NULL && opt->longName != NULL &&
		   (!LF_ISSET(ONEDASH) || F_ISSET(opt, ONEDASH)) &&
		   longOptionStrcmp(opt, longName, longNameLen))
	{
	    break;
	} else if (shortName && shortName == opt->shortName) {
	    break;
	}
    }

    if (opt->longName == NULL && !opt->shortName)
	return NULL;

    if (callback)
	*callback = (cb ? cbarg.cb : NULL);
    if (callbackData)
	*callbackData = (cb && !CBF_ISSET(cb, INC_DATA) ? cb->descrip : NULL);

    return opt;
}